

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

void __thiscall AbstractModuleClient::sendTimeRateRequest(AbstractModuleClient *this)

{
  TrodesMsg *in_RDI;
  TrodesMsg msg;
  TrodesMsg *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  AbstractModuleClient *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  TrodesMsg *in_stack_ffffffffffffffa0;
  allocator local_51;
  string local_50 [80];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"s",&local_51);
  TrodesMsg::TrodesMsg<char_const*>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff78,"info_req",(allocator *)&stack0xffffffffffffff77);
  sendMsgToTrodes(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  TrodesMsg::~TrodesMsg(in_RDI);
  return;
}

Assistant:

void AbstractModuleClient::sendTimeRateRequest(){
    TrodesMsg msg("s", INFO_TIMERATE);
    sendMsgToTrodes(TRODES_INFO_REQ, msg);
}